

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

int __thiscall CTPNSymBase::check_lvalue_resolved(CTPNSymBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CTcPrsSymtab *curtab;
  long *plVar4;
  
  iVar1 = (*(this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xc])();
  iVar2 = (*(this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xd])(this);
  do {
    iVar3 = (*symtab->_vptr_CTcPrsSymtab[2])
                      (symtab,CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
    plVar4 = (long *)CONCAT44(extraout_var_01,iVar3);
    if (plVar4 != (long *)0x0) goto LAB_00201a4b;
    symtab = symtab->parent_;
  } while (symtab != (CTcPrsSymtab *)0x0);
  plVar4 = (long *)0x0;
LAB_00201a4b:
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x78))(plVar4);
    iVar1 = (**(code **)(*plVar4 + 0x28))(plVar4);
    return iVar1;
  }
  return 0;
}

Assistant:

int CTPNSymBase::check_lvalue_resolved(class CTcPrsSymtab *symtab) const
{
    CTcSymbol *sym;

    /* look up the symbol in the given scope */
    sym = symtab->find(get_sym_text(), get_sym_text_len());
    if (sym != 0)
    {
        /* ask the symbol what it thinks */
        return sym->check_lvalue();
    }
    else
    {
        /* it's undefined - can't be an lvalue */
        return FALSE;
    }
}